

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void generateColumnNames(Parse *pParse,Select *pSelect)

{
  sqlite3 *db;
  Vdbe *pVVar1;
  ExprList *pEVar2;
  SrcList *pSVar3;
  ulong uVar4;
  Mem *pMVar5;
  Expr *pEVar6;
  Table *pTVar7;
  char *pcVar8;
  ushort uVar9;
  ulong uVar10;
  Select *pSVar11;
  code *xDel;
  long lVar12;
  ExprList_item *pEVar13;
  char **ppcVar14;
  long lVar15;
  NameContext local_68;
  
  if (pParse->explain != '\0') {
    return;
  }
  if (pParse->colNamesSet == '\0') {
    db = pParse->db;
    pVVar1 = pParse->pVdbe;
    do {
      pSVar11 = pSelect;
      pSelect = pSVar11->pPrior;
    } while (pSVar11->pPrior != (Select *)0x0);
    pEVar2 = pSVar11->pEList;
    pSVar3 = pSVar11->pSrc;
    pParse->colNamesSet = '\x01';
    uVar4 = db->flags;
    sqlite3VdbeSetNumCols(pVVar1,pEVar2->nExpr);
    if (0 < pEVar2->nExpr) {
      ppcVar14 = &pEVar2->a[0].zSpan;
      lVar15 = 0;
      lVar12 = 0;
      do {
        pcVar8 = ppcVar14[-1];
        if (pcVar8 == (char *)0x0) {
          if (((uVar4 & 0x44) == 0) ||
             (pEVar6 = ((ExprList_item *)(ppcVar14 + -2))->pExpr, pEVar6->op != 0xa2)) {
            if (*ppcVar14 == (char *)0x0) {
              pcVar8 = sqlite3MPrintf(db,"column%d",(ulong)((int)lVar12 + 1));
            }
            else {
              pcVar8 = sqlite3DbStrDup(db,*ppcVar14);
            }
          }
          else {
            uVar9 = pEVar6->iColumn;
            pTVar7 = (pEVar6->y).pTab;
            if ((short)uVar9 < 0) {
              uVar9 = pTVar7->iPKey;
              pcVar8 = "rowid";
              if (-1 < (short)uVar9) goto LAB_0019fbcc;
            }
            else {
LAB_0019fbcc:
              pcVar8 = pTVar7->aCol[uVar9].zName;
            }
            if ((uVar4 & 4) == 0) {
              if (pVVar1->db->mallocFailed == '\0') {
                pMVar5 = pVVar1->aColName;
                goto LAB_0019fb89;
              }
              goto LAB_0019fc67;
            }
            pcVar8 = sqlite3MPrintf(db,"%s.%s",pTVar7->zName);
          }
          if (pVVar1->db->mallocFailed == '\0') {
            pMVar5 = pVVar1->aColName;
            xDel = sqlite3MallocSize;
            goto LAB_0019fc62;
          }
        }
        else if (pVVar1->db->mallocFailed == '\0') {
          pMVar5 = pVVar1->aColName;
LAB_0019fb89:
          xDel = (_func_void_void_ptr *)0xffffffffffffffff;
LAB_0019fc62:
          sqlite3VdbeMemSetStr((Mem *)((long)&pMVar5->u + lVar15),pcVar8,-1,'\x01',xDel);
        }
LAB_0019fc67:
        lVar12 = lVar12 + 1;
        uVar10 = (ulong)pEVar2->nExpr;
        ppcVar14 = ppcVar14 + 4;
        lVar15 = lVar15 + 0x38;
      } while (lVar12 < (long)uVar10);
      pVVar1 = pParse->pVdbe;
      local_68.pNext = (NameContext *)0x0;
      if (0 < pEVar2->nExpr) {
        pEVar13 = pEVar2->a;
        lVar12 = 0;
        lVar15 = 0;
        local_68.pParse = pParse;
        local_68.pSrcList = pSVar3;
        do {
          pcVar8 = columnTypeImpl(&local_68,pEVar13->pExpr);
          if (pVVar1->db->mallocFailed == '\0') {
            sqlite3VdbeMemSetStr
                      ((Mem *)((long)&pVVar1->aColName[pVVar1->nResColumn].u + lVar12),pcVar8,-1,
                       '\x01',(_func_void_void_ptr *)0xffffffffffffffff);
            uVar10 = (ulong)(uint)pEVar2->nExpr;
          }
          lVar15 = lVar15 + 1;
          lVar12 = lVar12 + 0x38;
          pEVar13 = pEVar13 + 1;
        } while (lVar15 < (int)uVar10);
      }
    }
  }
  return;
}

Assistant:

static void generateColumnNames(
  Parse *pParse,      /* Parser context */
  Select *pSelect     /* Generate column names for this SELECT statement */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  Table *pTab;
  SrcList *pTabList;
  ExprList *pEList;
  sqlite3 *db = pParse->db;
  int fullName;    /* TABLE.COLUMN if no AS clause and is a direct table ref */
  int srcName;     /* COLUMN or TABLE.COLUMN if no AS clause and is direct */

#ifndef SQLITE_OMIT_EXPLAIN
  /* If this is an EXPLAIN, skip this step */
  if( pParse->explain ){
    return;
  }
#endif

  if( pParse->colNamesSet ) return;
  /* Column names are determined by the left-most term of a compound select */
  while( pSelect->pPrior ) pSelect = pSelect->pPrior;
  SELECTTRACE(1,pParse,pSelect,("generating column names\n"));
  pTabList = pSelect->pSrc;
  pEList = pSelect->pEList;
  assert( v!=0 );
  assert( pTabList!=0 );
  pParse->colNamesSet = 1;
  fullName = (db->flags & SQLITE_FullColNames)!=0;
  srcName = (db->flags & SQLITE_ShortColNames)!=0 || fullName;
  sqlite3VdbeSetNumCols(v, pEList->nExpr);
  for(i=0; i<pEList->nExpr; i++){
    Expr *p = pEList->a[i].pExpr;

    assert( p!=0 );
    assert( p->op!=TK_AGG_COLUMN );  /* Agg processing has not run yet */
    assert( p->op!=TK_COLUMN || p->y.pTab!=0 ); /* Covering idx not yet coded */
    if( pEList->a[i].zName ){
      /* An AS clause always takes first priority */
      char *zName = pEList->a[i].zName;
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_TRANSIENT);
    }else if( srcName && p->op==TK_COLUMN ){
      char *zCol;
      int iCol = p->iColumn;
      pTab = p->y.pTab;
      assert( pTab!=0 );
      if( iCol<0 ) iCol = pTab->iPKey;
      assert( iCol==-1 || (iCol>=0 && iCol<pTab->nCol) );
      if( iCol<0 ){
        zCol = "rowid";
      }else{
        zCol = pTab->aCol[iCol].zName;
      }
      if( fullName ){
        char *zName = 0;
        zName = sqlite3MPrintf(db, "%s.%s", pTab->zName, zCol);
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_DYNAMIC);
      }else{
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zCol, SQLITE_TRANSIENT);
      }
    }else{
      const char *z = pEList->a[i].zSpan;
      z = z==0 ? sqlite3MPrintf(db, "column%d", i+1) : sqlite3DbStrDup(db, z);
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, z, SQLITE_DYNAMIC);
    }
  }
  generateColumnTypes(pParse, pTabList, pEList);
}